

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool FIX::double_conversion::DigitGen
               (DiyFp low,DiyFp w,DiyFp high,Vector<char> buffer,int *length,int *kappa)

{
  char cVar1;
  uint32_t number;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t distance_too_high_w;
  uint64_t rest_00;
  DiyFp DVar10;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  bool local_159;
  bool local_139;
  DiyFp local_128;
  double_conversion *local_118;
  ulong uStack_110;
  int local_fc;
  uint64_t uStack_f8;
  int digit_1;
  int local_f0;
  DiyFp local_e8;
  double_conversion *local_d8;
  ulong uStack_d0;
  ulong local_c0;
  uint64_t rest;
  int local_b0;
  int digit;
  int divisor_exponent_plus_one;
  uint32_t divisor;
  uint64_t fractionals;
  undefined1 local_98 [4];
  uint32_t integrals;
  DiyFp one;
  undefined1 local_78 [8];
  DiyFp unsafe_interval;
  DiyFp too_high;
  DiyFp too_low;
  uint64_t unit;
  DiyFp high_local;
  DiyFp w_local;
  DiyFp low_local;
  
  unit = high.f_;
  high_local._8_8_ = w.f_;
  w_local._8_8_ = low.f_;
  w_local.f_._0_4_ = w.e_;
  high_local.f_._0_4_ = high.e_;
  iVar3 = DiyFp::e((DiyFp *)&w_local.e_);
  iVar4 = DiyFp::e((DiyFp *)&high_local.e_);
  local_139 = false;
  if (iVar3 == iVar4) {
    iVar3 = DiyFp::e((DiyFp *)&high_local.e_);
    iVar4 = DiyFp::e((DiyFp *)&unit);
    local_139 = iVar3 == iVar4;
  }
  if (!local_139) {
    __assert_fail("low.e() == w.e() && w.e() == high.e()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x132,
                  "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                 );
  }
  uVar5 = DiyFp::f((DiyFp *)&w_local.e_);
  uVar6 = DiyFp::f((DiyFp *)&unit);
  if (uVar6 - 1 < uVar5 + 1) {
    __assert_fail("low.f() + 1 <= high.f() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x133,
                  "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                 );
  }
  iVar3 = DiyFp::e((DiyFp *)&high_local.e_);
  local_159 = false;
  if (-0x3d < iVar3) {
    iVar3 = DiyFp::e((DiyFp *)&high_local.e_);
    local_159 = iVar3 < -0x1f;
  }
  if (local_159) {
    too_low.e_ = 1;
    too_low._12_4_ = 0;
    uVar5 = DiyFp::f((DiyFp *)&w_local.e_);
    iVar3 = DiyFp::e((DiyFp *)&w_local.e_);
    DiyFp::DiyFp((DiyFp *)&too_high.e_,uVar5 - 1,iVar3);
    uVar5 = DiyFp::f((DiyFp *)&unit);
    iVar3 = DiyFp::e((DiyFp *)&unit);
    DiyFp::DiyFp((DiyFp *)&unsafe_interval.e_,uVar5 + 1,iVar3);
    DVar10 = DiyFp::Minus((DiyFp *)&unsafe_interval.e_,(DiyFp *)&too_high.e_);
    one._8_8_ = DVar10.f_;
    unsafe_interval.f_._0_4_ = DVar10.e_;
    local_78 = (undefined1  [8])one._8_8_;
    iVar3 = DiyFp::e((DiyFp *)&high_local.e_);
    iVar4 = DiyFp::e((DiyFp *)&high_local.e_);
    DiyFp::DiyFp((DiyFp *)local_98,1L << (-(char)iVar3 & 0x3fU),iVar4);
    uVar5 = DiyFp::f((DiyFp *)&unsafe_interval.e_);
    iVar3 = DiyFp::e((DiyFp *)local_98);
    fractionals._4_4_ = (uint32_t)(uVar5 >> (-(char)iVar3 & 0x3fU));
    uVar5 = DiyFp::f((DiyFp *)&unsafe_interval.e_);
    uVar6 = DiyFp::f((DiyFp *)local_98);
    number = fractionals._4_4_;
    _divisor_exponent_plus_one = uVar5 & uVar6 - 1;
    iVar3 = DiyFp::e((DiyFp *)local_98);
    BiggestPowerTen(number,iVar3 + 0x40,(uint32_t *)&digit,&local_b0);
    *kappa = local_b0;
    *length = 0;
    while( true ) {
      if (*kappa < 1) {
        iVar3 = DiyFp::e((DiyFp *)local_98);
        uVar8 = _divisor_exponent_plus_one;
        if (iVar3 < -0x3c) {
          __assert_fail("one.e() >= -60",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                        ,0x179,
                        "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                       );
        }
        uVar5 = DiyFp::f((DiyFp *)local_98);
        if (uVar8 < uVar5) {
          uVar5 = DiyFp::f((DiyFp *)local_98);
          if (0x1999999999999999 < uVar5) {
            __assert_fail("(((static_cast<uint64_t>(0xFFFFFFFF) << 32) + 0xFFFFFFFFu)) / 10 >= one.f()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                          ,0x17b,
                          "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                         );
          }
          do {
            _divisor_exponent_plus_one = _divisor_exponent_plus_one * 10;
            too_low._8_8_ = too_low._8_8_ * 10;
            uVar5 = DiyFp::f((DiyFp *)local_78);
            DiyFp::set_f((DiyFp *)local_78,uVar5 * 10);
            uVar8 = _divisor_exponent_plus_one;
            iVar3 = DiyFp::e((DiyFp *)local_98);
            uVar8 = uVar8 >> (-(char)iVar3 & 0x3fU);
            local_fc = (int)uVar8;
            if (9 < local_fc) {
              __assert_fail("digit <= 9",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                            ,0x182,
                            "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                           );
            }
            pcVar7 = Vector<char>::operator[](&buffer,*length);
            *pcVar7 = (char)uVar8 + '0';
            *length = *length + 1;
            uVar5 = DiyFp::f((DiyFp *)local_98);
            uVar8 = uVar5 - 1 & _divisor_exponent_plus_one;
            *kappa = *kappa + -1;
            _divisor_exponent_plus_one = uVar8;
            uVar5 = DiyFp::f((DiyFp *)local_78);
          } while (uVar5 <= uVar8);
          local_118 = (double_conversion *)buffer.start_;
          uStack_110 = buffer._8_8_;
          iVar3 = *length;
          DVar10 = DiyFp::Minus((DiyFp *)&unsafe_interval.e_,(DiyFp *)&high_local.e_);
          local_128.f_ = DVar10.f_;
          local_128.e_ = DVar10.e_;
          uVar6 = DiyFp::f(&local_128);
          distance_too_high_w = DiyFp::f((DiyFp *)local_78);
          uVar5 = _divisor_exponent_plus_one;
          rest_00 = DiyFp::f((DiyFp *)local_98);
          buffer_01.start_ = uStack_110 & 0xffffffff;
          buffer_01.length_ = iVar3;
          buffer_01._12_4_ = 0;
          bVar2 = RoundWeed(local_118,buffer_01,(int)uVar6 * (int)too_low._8_8_,distance_too_high_w,
                            uVar5,rest_00,too_low._8_8_,CONCAT44(iVar3,in_stack_fffffffffffffdd8));
          return bVar2;
        }
        __assert_fail("fractionals < one.f()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x17a,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      rest._4_4_ = fractionals._4_4_ / (uint)digit;
      if (9 < (int)rest._4_4_) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                      ,0x15e,
                      "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
                     );
      }
      cVar1 = (char)rest._4_4_;
      pcVar7 = Vector<char>::operator[](&buffer,*length);
      *pcVar7 = cVar1 + '0';
      *length = *length + 1;
      fractionals._4_4_ = fractionals._4_4_ % (uint)digit;
      *kappa = *kappa + -1;
      uVar8 = (ulong)fractionals._4_4_;
      iVar3 = DiyFp::e((DiyFp *)local_98);
      uVar8 = (uVar8 << (-(char)iVar3 & 0x3fU)) + _divisor_exponent_plus_one;
      local_c0 = uVar8;
      uVar5 = DiyFp::f((DiyFp *)local_78);
      if (uVar8 < uVar5) break;
      digit = (uint)digit / 10;
    }
    local_d8 = (double_conversion *)buffer.start_;
    uStack_d0 = buffer._8_8_;
    iVar3 = *length;
    DVar10 = DiyFp::Minus((DiyFp *)&unsafe_interval.e_,(DiyFp *)&high_local.e_);
    uStack_f8 = DVar10.f_;
    local_f0 = DVar10.e_;
    local_e8.f_ = uStack_f8;
    local_e8.e_ = local_f0;
    uVar5 = DiyFp::f(&local_e8);
    uVar6 = DiyFp::f((DiyFp *)local_78);
    uVar8 = local_c0;
    uVar9 = (ulong)(uint)digit;
    iVar4 = DiyFp::e((DiyFp *)local_98);
    buffer_00.start_ = uStack_d0 & 0xffffffff;
    buffer_00.length_ = iVar3;
    buffer_00._12_4_ = 0;
    bVar2 = RoundWeed(local_d8,buffer_00,(int)uVar5,uVar6,uVar8,uVar9 << (-(char)iVar4 & 0x3fU),1,
                      CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    return bVar2;
  }
  __assert_fail("kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                ,0x134,
                "bool FIX::double_conversion::DigitGen(DiyFp, DiyFp, DiyFp, Vector<char>, int *, int *)"
               );
}

Assistant:

static bool DigitGen(DiyFp low,
                     DiyFp w,
                     DiyFp high,
                     Vector<char> buffer,
                     int* length,
                     int* kappa) {
  ASSERT(low.e() == w.e() && w.e() == high.e());
  ASSERT(low.f() + 1 <= high.f() - 1);
  ASSERT(kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent);
  // low, w and high are imprecise, but by less than one ulp (unit in the last
  // place).
  // If we remove (resp. add) 1 ulp from low (resp. high) we are certain that
  // the new numbers are outside of the interval we want the final
  // representation to lie in.
  // Inversely adding (resp. removing) 1 ulp from low (resp. high) would yield
  // numbers that are certain to lie in the interval. We will use this fact
  // later on.
  // We will now start by generating the digits within the uncertain
  // interval. Later we will weed out representations that lie outside the safe
  // interval and thus _might_ lie outside the correct interval.
  uint64_t unit = 1;
  DiyFp too_low = DiyFp(low.f() - unit, low.e());
  DiyFp too_high = DiyFp(high.f() + unit, high.e());
  // too_low and too_high are guaranteed to lie outside the interval we want the
  // generated number in.
  DiyFp unsafe_interval = DiyFp::Minus(too_high, too_low);
  // We now cut the input number into two parts: the integral digits and the
  // fractionals. We will not write any decimal separator though, but adapt
  // kappa instead.
  // Reminder: we are currently computing the digits (stored inside the buffer)
  // such that:   too_low < buffer * 10^kappa < too_high
  // We use too_high for the digit_generation and stop as soon as possible.
  // If we stop early we effectively round down.
  DiyFp one = DiyFp(static_cast<uint64_t>(1) << -w.e(), w.e());
  // Division by one is a shift.
  uint32_t integrals = static_cast<uint32_t>(too_high.f() >> -one.e());
  // Modulo by one is an and.
  uint64_t fractionals = too_high.f() & (one.f() - 1);
  uint32_t divisor;
  int divisor_exponent_plus_one;
  BiggestPowerTen(integrals, DiyFp::kSignificandSize - (-one.e()),
                  &divisor, &divisor_exponent_plus_one);
  *kappa = divisor_exponent_plus_one;
  *length = 0;
  // Loop invariant: buffer = too_high / 10^kappa  (integer division)
  // The invariant holds for the first iteration: kappa has been initialized
  // with the divisor exponent + 1. And the divisor is the biggest power of ten
  // that is smaller than integrals.
  while (*kappa > 0) {
    int digit = integrals / divisor;
    ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    integrals %= divisor;
    (*kappa)--;
    // Note that kappa now equals the exponent of the divisor and that the
    // invariant thus holds again.
    uint64_t rest =
        (static_cast<uint64_t>(integrals) << -one.e()) + fractionals;
    // Invariant: too_high = buffer * 10^kappa + DiyFp(rest, one.e())
    // Reminder: unsafe_interval.e() == one.e()
    if (rest < unsafe_interval.f()) {
      // Rounding down (by not emitting the remaining digits) yields a number
      // that lies within the unsafe interval.
      return RoundWeed(buffer, *length, DiyFp::Minus(too_high, w).f(),
                       unsafe_interval.f(), rest,
                       static_cast<uint64_t>(divisor) << -one.e(), unit);
    }
    divisor /= 10;
  }

  // The integrals have been generated. We are at the point of the decimal
  // separator. In the following loop we simply multiply the remaining digits by
  // 10 and divide by one. We just need to pay attention to multiply associated
  // data (like the interval or 'unit'), too.
  // Note that the multiplication by 10 does not overflow, because w.e >= -60
  // and thus one.e >= -60.
  ASSERT(one.e() >= -60);
  ASSERT(fractionals < one.f());
  ASSERT(UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF) / 10 >= one.f());
  for (;;) {
    fractionals *= 10;
    unit *= 10;
    unsafe_interval.set_f(unsafe_interval.f() * 10);
    // Integer division by one.
    int digit = static_cast<int>(fractionals >> -one.e());
    ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    fractionals &= one.f() - 1;  // Modulo by one.
    (*kappa)--;
    if (fractionals < unsafe_interval.f()) {
      return RoundWeed(buffer, *length, DiyFp::Minus(too_high, w).f() * unit,
                       unsafe_interval.f(), fractionals, one.f(), unit);
    }
  }
}